

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
read_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
         char *filename,long offset,size_t bytes)

{
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  size_type __n;
  ifstream input;
  undefined1 auStack_238 [7];
  allocator_type local_231;
  long local_230 [3];
  undefined4 auStack_214 [123];
  
  std::ifstream::ifstream(local_230);
  lVar1 = *(long *)(local_230[0] + -0x18);
  *(undefined4 *)((long)auStack_214 + lVar1) = 7;
  std::ios::clear((int)auStack_238 + (int)lVar1 + 8);
  std::ifstream::open((char *)local_230,(_Ios_Openmode)filename);
  std::istream::seekg((long)local_230,_S_beg);
  iVar2 = std::istream::tellg();
  std::istream::seekg((long)local_230,(_Ios_Seekdir)offset);
  if (offset < 0) {
    if (bytes == 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_0014a1f8;
      __cxa_throw(puVar3,&unit_test_exception::typeinfo,std::exception::~exception);
    }
    offset = (long)iVar2 - bytes;
  }
  __n = iVar2 - offset;
  if (bytes != 0) {
    __n = bytes;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_231);
  std::istream::read((char *)local_230,
                     (long)(__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

vector<uint8_t> read_file(const char* filename, long offset, size_t bytes)
{
    ifstream input;
    input.exceptions(ios::eofbit | ios::failbit | ios::badbit);
    input.open(filename, ios::in | ios::binary);

    input.seekg(0, ios::end);
    const auto byte_count_file{static_cast<int>(input.tellg())};
    input.seekg(offset, ios::beg);

    if (offset < 0)
    {
        assert::is_true(bytes != 0);
        offset = static_cast<long>(byte_count_file - bytes);
    }
    if (bytes == 0)
    {
        bytes = static_cast<size_t>(byte_count_file) - offset;
    }

    vector<uint8_t> buffer(bytes);
    read(input, buffer);

    return buffer;
}